

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall cs_impl::any::holder<cs::type_t>::duplicate(holder<cs::type_t> *this)

{
  holder<cs::type_t> *this_00;
  
  if ((DAT_00338ce8 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::type_t> *)operator_new(0x48);
  }
  else {
    this_00 = *(holder<cs::type_t> **)
               (&holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator + DAT_00338ce8 * 8);
    DAT_00338ce8 = DAT_00338ce8 + -1;
  }
  holder<cs::type_t&>(this_00,&this->mDat);
  return &this_00->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}